

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool getTypedProperty<bool>
               (cmGeneratorTarget *tgt,string *prop,
               cmGeneratorExpressionInterpreter *genexInterpreter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  cmValue cVar4;
  string *psVar5;
  char *extraout_RDX;
  string_view value;
  string local_48;
  
  if (genexInterpreter != (cmGeneratorExpressionInterpreter *)0x0) {
    cVar4 = cmGeneratorTarget::GetProperty(tgt,prop);
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    if (cVar4.Value == (string *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    }
    else {
      pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
    }
    psVar5 = cmGeneratorExpressionInterpreter::Evaluate(genexInterpreter,&local_48,prop);
    value._M_str = extraout_RDX;
    value._M_len = (size_t)(psVar5->_M_dataplus)._M_p;
    bVar3 = cmValue::IsOn((cmValue *)psVar5->_M_string_length,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return bVar3;
  }
  bVar3 = cmTarget::GetPropertyAsBool(tgt->Target,prop);
  return bVar3;
}

Assistant:

bool getTypedProperty<bool>(cmGeneratorTarget const* tgt,
                            const std::string& prop,
                            cmGeneratorExpressionInterpreter* genexInterpreter)
{
  if (genexInterpreter == nullptr) {
    return tgt->GetPropertyAsBool(prop);
  }

  cmValue value = tgt->GetProperty(prop);
  return cmIsOn(genexInterpreter->Evaluate(value ? *value : "", prop));
}